

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::SetArgcArgv
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  char *pcVar2;
  ostream *this_00;
  string local_388;
  undefined1 local_368 [8];
  ostringstream tmpStream;
  uint local_1ec;
  string local_1e8 [4];
  uint t;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream strStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMakefile *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  std::ostream::operator<<(local_190,sVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"CMAKE_ARGC",&local_1c1);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_1c0,pcVar2);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  local_1ec = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar1 <= local_1ec) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
    this_00 = std::operator<<((ostream *)local_368,"CMAKE_ARGV");
    std::ostream::operator<<(this_00,local_1ec);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,(ulong)local_1ec);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    AddDefinition(this,&local_388,pcVar2);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
    local_1ec = local_1ec + 1;
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmMakefile::SetArgcArgv(const std::vector<std::string>& args)
{
  std::ostringstream strStream;
  strStream << args.size();
  this->AddDefinition("CMAKE_ARGC", strStream.str().c_str());
  // this->MarkVariableAsUsed("CMAKE_ARGC");

  for (unsigned int t = 0; t < args.size(); ++t) {
    std::ostringstream tmpStream;
    tmpStream << "CMAKE_ARGV" << t;
    this->AddDefinition(tmpStream.str(), args[t].c_str());
    // this->MarkVariableAsUsed(tmpStream.str().c_str());
  }
}